

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderRenderCase.cpp
# Opt level: O3

void __thiscall deqp::gls::ShaderRenderCase::~ShaderRenderCase(ShaderRenderCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pTVar2;
  pointer pMVar3;
  pointer pcVar4;
  
  (this->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderRenderCase_02185b28;
  deinit(this);
  pTVar2 = (this->m_textures).
           super__Vector_base<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar2 != (pointer)0x0) {
    operator_delete(pTVar2,(long)(this->m_textures).
                                 super__Vector_base<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pTVar2);
  }
  pMVar3 = (this->m_userAttribTransforms).
           super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pMVar3 != (pointer)0x0) {
    operator_delete(pMVar3,(long)(this->m_userAttribTransforms).
                                 super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pMVar3);
  }
  pcVar4 = (this->m_fragShaderSource)._M_dataplus._M_p;
  paVar1 = &(this->m_fragShaderSource).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->m_vertShaderSource)._M_dataplus._M_p;
  paVar1 = &(this->m_vertShaderSource).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  tcu::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

ShaderRenderCase::~ShaderRenderCase (void)
{
	ShaderRenderCase::deinit();
}